

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O2

string * minibag::Recorder::timeToStr<miniros::WallTime>
                   (string *__return_storage_ptr__,WallTime ros_t)

{
  tm *__tp;
  time_t time;
  char timeString [1024];
  allocator<char> local_421;
  time_t local_420;
  char local_418 [1032];
  
  local_420 = ::time((time_t *)0x0);
  __tp = gmtime(&local_420);
  strftime(local_418,0x400,"%Y-%m-%d-%H-%M-%S",__tp);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_418,&local_421);
  return __return_storage_ptr__;
}

Assistant:

std::string Recorder::timeToStr(T ros_t)
{
  (void)ros_t;

  char timeString[1024];
  
  // Example of the very popular RFC 3339 format UTC time
  std::time_t time = std::time({});
  std::strftime(timeString, sizeof(timeString), "%Y-%m-%d-%H-%M-%S", std::gmtime(&time));
  
  return std::string(timeString);
}